

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_arithmetic.cpp
# Opt level: O0

bool dxil_spv::emit_pack4x8_instruction(Impl *impl,CallInst *instruction)

{
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  bool bVar1;
  short sVar2;
  Id IVar3;
  uint uVar4;
  Builder *this;
  Value *pVVar5;
  Type *type;
  Operation *pOVar6;
  Operation *this_00;
  int iVar7;
  Operation *bitcast_op;
  Operation *narrow_op;
  Operation *clamp_op;
  Id int4_type;
  Id int_type;
  Id local_cc;
  Id local_c8;
  Id local_c4;
  iterator local_c0;
  undefined8 local_b8;
  undefined1 local_b0 [8];
  Vector<spv::Id> hi_ids;
  Id local_90;
  Id local_8c;
  Id local_88;
  Id local_84;
  iterator local_80;
  undefined8 local_78;
  undefined1 local_70 [8];
  Vector<spv::Id> lo_ids;
  Id hi_id;
  Id lo_id;
  Id vec_id;
  uint i;
  Id elements [4];
  uint32_t clamp_op_literal;
  Id uint_type;
  Type *element_type;
  Builder *builder;
  CallInst *instruction_local;
  Impl *impl_local;
  
  this = Converter::Impl::builder(impl);
  spv::Builder::addCapability(this,CapabilityInt8);
  pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2);
  type = LLVMBC::Value::getType(pVVar5);
  elements[3] = Converter::Impl::get_type_id(impl,type,0);
  bVar1 = get_constant_operand(&instruction->super_Instruction,1,elements + 2);
  if (bVar1) {
    for (lo_id = 0; lo_id < 4; lo_id = lo_id + 1) {
      pVVar5 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,lo_id + 2);
      IVar3 = Converter::Impl::get_id_for_value(impl,pVVar5,0);
      (&vec_id)[lo_id] = IVar3;
    }
    hi_id = Converter::Impl::build_vector(impl,elements[3],&vec_id,4);
    if (elements[2] != 0) {
      if (impl->glsl_std450_ext == 0) {
        IVar3 = spv::Builder::import(this,"GLSL.std.450");
        impl->glsl_std450_ext = IVar3;
      }
      uVar4 = LLVMBC::Type::getIntegerBitWidth(type);
      if (uVar4 == 0x10) {
        sVar2 = -0x80;
        if (elements[2] == 1) {
          sVar2 = 0;
        }
        lo_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             spv::Builder::makeInt16Constant(this,sVar2,false);
        sVar2 = 0x7f;
        if (elements[2] == 1) {
          sVar2 = 0xff;
        }
        lo_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             spv::Builder::makeInt16Constant(this,sVar2,false);
      }
      else {
        iVar7 = -0x80;
        if (elements[2] == 1) {
          iVar7 = 0;
        }
        lo_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
             spv::Builder::makeIntConstant(this,iVar7,false);
        iVar7 = 0x7f;
        if (elements[2] == 1) {
          iVar7 = 0xff;
        }
        lo_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             spv::Builder::makeIntConstant(this,iVar7,false);
      }
      local_90 = lo_ids.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      local_8c = lo_ids.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      local_88 = lo_ids.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      local_84 = lo_ids.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
      local_80 = &local_90;
      local_78 = 4;
      __l_00._M_len = 4;
      __l_00._M_array = local_80;
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_70,
                 __l_00,(allocator_type *)
                        ((long)&hi_ids.
                                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
      int_type = (Id)lo_ids.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_cc = (Id)lo_ids.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_c8 = (Id)lo_ids.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_c4 = (Id)lo_ids.
                     super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_c0 = &int_type;
      local_b8 = 4;
      __l._M_len = 4;
      __l._M_array = local_c0;
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::vector
                ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_b0,__l
                 ,(allocator_type *)((long)&int4_type + 3));
      uVar4 = LLVMBC::Type::getIntegerBitWidth(type);
      IVar3 = spv::Builder::makeIntType(this,uVar4);
      IVar3 = spv::Builder::makeVectorType(this,IVar3,4);
      lo_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage._4_4_ =
           spv::Builder::makeCompositeConstant(this,IVar3,(Vector<Id> *)local_70,false);
      lo_ids.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage._0_4_ =
           spv::Builder::makeCompositeConstant(this,IVar3,(Vector<Id> *)local_b0,false);
      pOVar6 = Converter::Impl::allocate(impl,OpExtInst,IVar3);
      Operation::add_id(pOVar6,impl->glsl_std450_ext);
      Operation::add_literal(pOVar6,0x2d);
      Operation::add_id(pOVar6,hi_id);
      Operation::add_id(pOVar6,lo_ids.
                               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      Operation::add_id(pOVar6,(Id)lo_ids.
                                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
      Converter::Impl::add(impl,pOVar6,false);
      hi_id = pOVar6->id;
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_b0);
      std::vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>::~vector
                ((vector<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_> *)local_70);
    }
    IVar3 = spv::Builder::makeUintType(this,8);
    IVar3 = spv::Builder::makeVectorType(this,IVar3,4);
    pOVar6 = Converter::Impl::allocate(impl,OpUConvert,IVar3);
    Operation::add_id(pOVar6,hi_id);
    Converter::Impl::add(impl,pOVar6,false);
    this_00 = Converter::Impl::allocate(impl,OpBitcast,(Value *)instruction);
    Operation::add_id(this_00,pOVar6->id);
    Converter::Impl::add(impl,this_00,false);
    impl_local._7_1_ = true;
  }
  else {
    impl_local._7_1_ = false;
  }
  return impl_local._7_1_;
}

Assistant:

bool emit_pack4x8_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	auto &builder = impl.builder();
	builder.addCapability(spv::CapabilityInt8);

	auto *element_type = instruction->getOperand(2)->getType();
	spv::Id uint_type = impl.get_type_id(element_type);

	uint32_t clamp_op_literal;
	if (!get_constant_operand(instruction, 1, &clamp_op_literal))
		return false;

	spv::Id elements[4];
	for (unsigned i = 0; i < 4; i++)
		elements[i] = impl.get_id_for_value(instruction->getOperand(2 + i));

	spv::Id vec_id = impl.build_vector(uint_type, elements, 4);
	if (clamp_op_literal != 0)
	{
		// Signed saturate with u8 range or s8 range.
		if (!impl.glsl_std450_ext)
			impl.glsl_std450_ext = builder.import("GLSL.std.450");

		spv::Id lo_id, hi_id;
		if (element_type->getIntegerBitWidth() == 16)
		{
			lo_id = builder.makeInt16Constant(clamp_op_literal == 1 ? 0 : -128);
			hi_id = builder.makeInt16Constant(clamp_op_literal == 1 ? 255 : 127);
		}
		else
		{
			lo_id = builder.makeIntConstant(clamp_op_literal == 1 ? 0 : -128);
			hi_id = builder.makeIntConstant(clamp_op_literal == 1 ? 255 : 127);
		}

		Vector<spv::Id> lo_ids = { lo_id, lo_id, lo_id, lo_id };
		Vector<spv::Id> hi_ids = { hi_id, hi_id, hi_id, hi_id };

		spv::Id int_type = builder.makeIntType(element_type->getIntegerBitWidth());
		spv::Id int4_type = builder.makeVectorType(int_type, 4);
		lo_id = builder.makeCompositeConstant(int4_type, lo_ids);
		hi_id = builder.makeCompositeConstant(int4_type, hi_ids);

		auto *clamp_op = impl.allocate(spv::OpExtInst, int4_type);
		clamp_op->add_id(impl.glsl_std450_ext);
		clamp_op->add_literal(GLSLstd450SClamp);
		clamp_op->add_id(vec_id);
		clamp_op->add_id(lo_id);
		clamp_op->add_id(hi_id);
		impl.add(clamp_op);
		vec_id = clamp_op->id;
	}

	auto *narrow_op = impl.allocate(spv::OpUConvert, builder.makeVectorType(builder.makeUintType(8), 4));
	narrow_op->add_id(vec_id);
	impl.add(narrow_op);

	auto *bitcast_op = impl.allocate(spv::OpBitcast, instruction);
	bitcast_op->add_id(narrow_op->id);
	impl.add(bitcast_op);

	return true;
}